

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O0

void __thiscall
soplex::
SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::freeAll(SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *this)

{
  bool bVar1;
  long in_RDI;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  *unaff_retaddr;
  
  if (*(long *)(in_RDI + 0x140) != 0) {
    spx_free<int*>((int **)0x349496);
  }
  if (*(long *)(in_RDI + 0x138) != 0) {
    spx_free<int*>((int **)0x3494ba);
  }
  if (*(long *)(in_RDI + 0x150) != 0) {
    spx_free<int*>((int **)0x3494e2);
  }
  if (*(long *)(in_RDI + 0x148) != 0) {
    spx_free<int*>((int **)0x349506);
  }
  if (*(long *)(in_RDI + 0x210) != 0) {
    spx_free<soplex::CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::Dring*>
              ((Dring **)0x34952e);
  }
  bVar1 = std::
          vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ::empty(unaff_retaddr);
  if (!bVar1) {
    std::
    vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ::clear((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             *)0x349564);
  }
  if (*(long *)(in_RDI + 0x238) != 0) {
    spx_free<int*>((int **)0x34958c);
  }
  if (*(long *)(in_RDI + 0x240) != 0) {
    spx_free<int*>((int **)0x3495b4);
  }
  if (*(long *)(in_RDI + 0x248) != 0) {
    spx_free<int*>((int **)0x3495dc);
  }
  if (*(long *)(in_RDI + 0x250) != 0) {
    spx_free<int*>((int **)0x349604);
  }
  if (*(long *)(in_RDI + 0x270) != 0) {
    spx_free<soplex::CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::Dring*>
              ((Dring **)0x349630);
  }
  if (*(long *)(in_RDI + 0x280) != 0) {
    spx_free<int*>((int **)0x34965c);
  }
  if (*(long *)(in_RDI + 0x2a0) != 0) {
    spx_free<int*>((int **)0x349688);
  }
  if (*(long *)(in_RDI + 0x2a8) != 0) {
    spx_free<int*>((int **)0x3496b4);
  }
  if (*(long *)(in_RDI + 0x2b0) != 0) {
    spx_free<int*>((int **)0x3496e0);
  }
  bVar1 = std::
          vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ::empty(unaff_retaddr);
  if (!bVar1) {
    std::
    vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ::clear((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             *)0x349716);
  }
  if (*(long *)(in_RDI + 0x178) != 0) {
    spx_free<int*>((int **)0x34973e);
  }
  if (*(long *)(in_RDI + 400) != 0) {
    spx_free<int*>((int **)0x349766);
  }
  if (*(long *)(in_RDI + 0x198) != 0) {
    spx_free<int*>((int **)0x34978e);
  }
  bVar1 = std::
          vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ::empty(unaff_retaddr);
  if (!bVar1) {
    std::
    vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ::clear((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             *)0x3497cc);
  }
  if (*(long *)(in_RDI + 0x1c0) != 0) {
    spx_free<int*>((int **)0x3497f4);
  }
  if (*(long *)(in_RDI + 0x1c8) != 0) {
    spx_free<int*>((int **)0x34981c);
  }
  if (*(long *)(in_RDI + 0x1d0) != 0) {
    spx_free<int*>((int **)0x349844);
  }
  if (*(long *)(in_RDI + 0x1d8) != 0) {
    spx_free<int*>((int **)0x34986f);
  }
  if (*(long *)(in_RDI + 0x508) != 0) {
    (**(code **)**(undefined8 **)(in_RDI + 0x508))();
    spx_free<soplex::Timer*>((Timer **)0x3498a0);
  }
  if (*(long *)(in_RDI + 0x2c0) != 0) {
    (**(code **)**(undefined8 **)(in_RDI + 0x2c0))();
    spx_free<soplex::Timer*>((Timer **)0x3498d5);
  }
  return;
}

Assistant:

void SLUFactor<R>::freeAll()
{

   if(this->row.perm)
      spx_free(this->row.perm);

   if(this->row.orig)
      spx_free(this->row.orig);

   if(this->col.perm)
      spx_free(this->col.perm);

   if(this->col.orig)
      spx_free(this->col.orig);

   if(this->u.row.elem)
      spx_free(this->u.row.elem);

   if(!this->u.row.val.empty())
      this->u.row.val.clear();

   if(this->u.row.idx)
      spx_free(this->u.row.idx);

   if(this->u.row.start)
      spx_free(this->u.row.start);

   if(this->u.row.len)
      spx_free(this->u.row.len);

   if(this->u.row.max)
      spx_free(this->u.row.max);

   if(this->u.col.elem)
      spx_free(this->u.col.elem);

   if(this->u.col.idx)
      spx_free(this->u.col.idx);

   if(this->u.col.start)
      spx_free(this->u.col.start);

   if(this->u.col.len)
      spx_free(this->u.col.len);

   if(this->u.col.max)
      spx_free(this->u.col.max);

   if(!this->l.val.empty())
      this->l.val.clear();

   if(this->l.idx)
      spx_free(this->l.idx);

   if(this->l.start)
      spx_free(this->l.start);

   if(this->l.row)
      spx_free(this->l.row);


   if(!this->u.col.val.empty())
      this->u.col.val.clear();

   if(this->l.ridx)
      spx_free(this->l.ridx);

   if(this->l.rbeg)
      spx_free(this->l.rbeg);

   if(this->l.rorig)
      spx_free(this->l.rorig);

   if(this->l.rperm)
      spx_free(this->l.rperm);

   if(solveTime)
   {
      solveTime->~Timer();
      spx_free(solveTime);
   }

   if(this->factorTime)
   {
      this->factorTime->~Timer();
      spx_free(this->factorTime);
   }
}